

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.hpp
# Opt level: O0

void __thiscall tcmalloc::CentralFreelist::Populate(CentralFreelist *this)

{
  bool bVar1;
  int iVar2;
  PageHeap *pPVar3;
  Span *span_00;
  uint64_t uVar4;
  Span *span;
  CentralFreelist *this_local;
  
  pPVar3 = PageHeap::Instance();
  span_00 = PageHeap::New(pPVar3,this->class_pages_);
  if (span_00->npages != this->class_pages_) {
    __assert_fail("span->npages == class_pages_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                  ,0x8e,"void tcmalloc::CentralFreelist::Populate()");
  }
  pPVar3 = PageHeap::Instance();
  PageHeap::RegisterSizeClass(pPVar3,span_00,(long)this->class_);
  uVar4 = Span::InitFreeList(span_00,this->class_bytes_);
  this->free_objects_ = uVar4 + this->free_objects_;
  iVar2 = FreeList::FreeObjects(&span_00->freelist);
  if (0 < iVar2) {
    InsertToList(this,&this->nonempty_,span_00);
    bVar1 = CheckState(this);
    if (!bVar1) {
      __assert_fail("CheckState()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                    ,0x94,"void tcmalloc::CentralFreelist::Populate()");
    }
    return;
  }
  __assert_fail("span->freelist.FreeObjects() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                ,0x92,"void tcmalloc::CentralFreelist::Populate()");
}

Assistant:

void Populate() {
        Span* span = PageHeap::Instance()->New(class_pages_);
        assert(span->npages == class_pages_);
        PageHeap::Instance()->RegisterSizeClass(span, class_);

        free_objects_ += span->InitFreeList(class_bytes_);
        assert(span->freelist.FreeObjects() > 0);
        InsertToList(&nonempty_, span);
        assert(CheckState());
    }